

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O2

int arkStep_RelaxDeltaE(ARKodeMem ark_mem,ARKRelaxJacFn relax_jac_fn,long *num_relax_jac_evals,
                       sunrealtype *delta_e_out)

{
  void *pvVar1;
  N_Vector p_Var2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  N_Vector p_Var8;
  long lVar9;
  sunrealtype sVar10;
  double dVar11;
  double dVar12;
  N_Vector local_60;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar5 = -0x15;
    arkProcessError(ark_mem,-0x15,0xd76,"arkStep_RelaxDeltaE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    p_Var2 = ark_mem->tempv3;
    local_60 = ark_mem->tempv2;
    *delta_e_out = 0.0;
    puVar3 = *(undefined8 **)((long)pvVar1 + 0x1a8);
    puVar4 = *(undefined8 **)((long)pvVar1 + 0x1b0);
    sVar10 = 0.0;
    lVar9 = 0;
    for (lVar6 = 0; lVar6 < *(int *)((long)pvVar1 + 100); lVar6 = lVar6 + 1) {
      if ((*(int *)((long)pvVar1 + 0x20) == 0) && (*(int *)((long)pvVar1 + 0x178) != 1)) {
        *puVar3 = 0x3ff0000000000000;
        *puVar4 = ark_mem->yn;
        for (lVar7 = 1; lVar9 + lVar7 != 1; lVar7 = lVar7 + 1) {
          puVar3[lVar7] =
               ark_mem->h *
               *(double *)
                (*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x68) + 0x10) + lVar6 * 8) + -8 +
                lVar7 * 8);
          puVar4[lVar7] = *(undefined8 *)(*(long *)((long)pvVar1 + 0x28) + -8 + lVar7 * 8);
        }
        iVar5 = N_VLinearCombination(lVar7,puVar3,puVar4,local_60);
        if (iVar5 != 0) {
          return -0x1c;
        }
      }
      else {
        local_60 = *(N_Vector *)(*(long *)((long)pvVar1 + 0x38) + lVar6 * 8);
      }
      iVar5 = (*relax_jac_fn)(local_60,p_Var2,ark_mem->user_data);
      *num_relax_jac_evals = *num_relax_jac_evals + 1;
      if (iVar5 < 0) {
        return -0x2e;
      }
      if (iVar5 != 0) {
        return 2;
      }
      if (*(int *)((long)pvVar1 + 0x1c) == 0) {
        p_Var8 = *(N_Vector *)(*(long *)((long)pvVar1 + 0x30) + lVar6 * 8);
        if (*(int *)((long)pvVar1 + 0x178) == 1) {
          N_VScale(0x3ff0000000000000,p_Var8,local_60);
          p_Var8 = local_60;
        }
        lVar7 = *(long *)((long)pvVar1 + 0x70);
LAB_00121163:
        dVar11 = *(double *)(*(long *)(lVar7 + 0x20) + lVar6 * 8);
      }
      else {
        if (*(int *)((long)pvVar1 + 0x20) == 0) {
          p_Var8 = *(N_Vector *)(*(long *)((long)pvVar1 + 0x28) + lVar6 * 8);
          if (*(int *)((long)pvVar1 + 0x178) == 1) {
            N_VScale(0x3ff0000000000000,p_Var8,local_60);
            p_Var8 = local_60;
          }
          lVar7 = *(long *)((long)pvVar1 + 0x68);
          goto LAB_00121163;
        }
        N_VLinearSum(*(undefined8 *)(*(long *)(*(long *)((long)pvVar1 + 0x68) + 0x20) + lVar6 * 8),
                     *(undefined8 *)(*(long *)(*(long *)((long)pvVar1 + 0x70) + 0x20) + lVar6 * 8),
                     *(undefined8 *)(*(long *)((long)pvVar1 + 0x28) + lVar6 * 8),
                     *(undefined8 *)(*(long *)((long)pvVar1 + 0x30) + lVar6 * 8),local_60);
        dVar11 = 1.0;
        p_Var8 = local_60;
      }
      if ((*(int *)((long)pvVar1 + 0x178) == 1) &&
         (iVar5 = (**(code **)((long)pvVar1 + 0x160))
                            (*(undefined8 *)((long)pvVar1 + 0xe8),ark_mem,p_Var8), iVar5 != 0)) {
        return -0x10;
      }
      if ((p_Var2->ops->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) ||
         (p_Var2->ops->nvdotprodmultiallreduce ==
          (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0)) {
        dVar12 = (double)N_VDotProd(p_Var2,p_Var8);
      }
      else {
        dVar12 = (double)N_VDotProdLocal(p_Var2,p_Var8);
      }
      sVar10 = dVar11 * dVar12 + *delta_e_out;
      *delta_e_out = sVar10;
      lVar9 = lVar9 + -1;
    }
    if ((p_Var2->ops->nvdotprodlocal != (_func_sunrealtype_N_Vector_N_Vector *)0x0) &&
       (p_Var2->ops->nvdotprodmultiallreduce != (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0
       )) {
      iVar5 = N_VDotProdMultiAllReduce(1,p_Var2,delta_e_out);
      if (iVar5 != 0) {
        return -0x1c;
      }
      sVar10 = *delta_e_out;
    }
    *delta_e_out = sVar10 * ark_mem->h;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int arkStep_RelaxDeltaE(ARKodeMem ark_mem, ARKRelaxJacFn relax_jac_fn,
                        long int* num_relax_jac_evals, sunrealtype* delta_e_out)
{
  int i, j, nvec, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeARKStepMem step_mem;
  N_Vector z_stage = ark_mem->tempv2;
  N_Vector J_relax = ark_mem->tempv3;
  N_Vector rhs_tmp = NULL;
  sunrealtype bi   = ONE;

  /* Access the stepper memory structure */
  if (!(ark_mem->step_mem))
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return ARK_MEM_NULL;
  }
  step_mem = (ARKodeARKStepMem)(ark_mem->step_mem);

  /* Initialize output */
  *delta_e_out = ZERO;

  /* Set arrays for fused vector operation */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  for (i = 0; i < step_mem->stages; i++)
  {
    if (step_mem->implicit || step_mem->mass_type == MASS_FIXED)
    {
      /* Use stored stages */
      z_stage = step_mem->z[i];
    }
    else
    {
      /* Reconstruct explicit stages */
      nvec = 0;

      cvals[nvec] = ONE;
      Xvecs[nvec] = ark_mem->yn;
      nvec++;

      for (j = 0; j < i; j++)
      {
        cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
        Xvecs[nvec] = step_mem->Fe[j];
        nvec++;
      }

      retval = N_VLinearCombination(nvec, cvals, Xvecs, z_stage);
      if (retval) { return ARK_VECTOROP_ERR; }
    }

    /* Evaluate the Jacobian at z_i */
    retval = relax_jac_fn(z_stage, J_relax, ark_mem->user_data);
    (*num_relax_jac_evals)++;
    if (retval < 0) { return ARK_RELAX_JAC_FAIL; }
    if (retval > 0) { return ARK_RELAX_JAC_RECV; }

    /* Reset temporary RHS alias */
    rhs_tmp = z_stage;

    /* Compute delta_e = h * sum_i b_i * <relax_jac(z_i), f_i> */
    if (step_mem->explicit && step_mem->implicit)
    {
      N_VLinearSum(step_mem->Be->b[i], step_mem->Fe[i], step_mem->Bi->b[i],
                   step_mem->Fi[i], rhs_tmp);
      bi = ONE;
    }
    else if (step_mem->explicit)
    {
      if (step_mem->mass_type == MASS_FIXED)
      {
        N_VScale(ONE, step_mem->Fe[i], rhs_tmp);
      }
      else { rhs_tmp = step_mem->Fe[i]; }
      bi = step_mem->Be->b[i];
    }
    else
    {
      if (step_mem->mass_type == MASS_FIXED)
      {
        N_VScale(ONE, step_mem->Fi[i], rhs_tmp);
      }
      else { rhs_tmp = step_mem->Fi[i]; }
      bi = step_mem->Bi->b[i];
    }

    if (step_mem->mass_type == MASS_FIXED)
    {
      retval = step_mem->msolve((void*)ark_mem, rhs_tmp, step_mem->nlscoef);
      if (retval) { return ARK_MASSSOLVE_FAIL; }
    }

    /* Update estimate of relaxation function change */
    if (J_relax->ops->nvdotprodlocal && J_relax->ops->nvdotprodmultiallreduce)
    {
      *delta_e_out += bi * N_VDotProdLocal(J_relax, rhs_tmp);
    }
    else { *delta_e_out += bi * N_VDotProd(J_relax, rhs_tmp); }
  }

  if (J_relax->ops->nvdotprodlocal && J_relax->ops->nvdotprodmultiallreduce)
  {
    retval = N_VDotProdMultiAllReduce(1, J_relax, delta_e_out);
    if (retval) { return ARK_VECTOROP_ERR; }
  }

  *delta_e_out *= ark_mem->h;

  return ARK_SUCCESS;
}